

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_internal_V2_annotation.cpp
# Opt level: O3

bool __thiscall
ON_OBSOLETE_V5_DimRadial::GetArrowHeadTip(ON_OBSOLETE_V5_DimRadial *this,ON_2dPoint *arrowhead_tip)

{
  int iVar1;
  ON_2dPoint *pOVar2;
  double dVar3;
  
  iVar1 = (this->super_ON_OBSOLETE_V5_Annotation).m_points.super_ON_SimpleArray<ON_2dPoint>.m_count;
  if (iVar1 < 2) {
    ON_2dPoint::Set(arrowhead_tip,0.0,0.0);
  }
  else {
    pOVar2 = (this->super_ON_OBSOLETE_V5_Annotation).m_points.super_ON_SimpleArray<ON_2dPoint>.m_a;
    dVar3 = pOVar2[1].y;
    arrowhead_tip->x = pOVar2[1].x;
    arrowhead_tip->y = dVar3;
  }
  return 1 < iVar1;
}

Assistant:

bool ON_OBSOLETE_V5_TextExtra::DrawTextMask() const
{
  return m_bDrawMask;
}